

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

int32_t u_unescape_63(char *src,UChar *dest,int32_t destCapacity)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  size_t sVar3;
  int32_t iVar4;
  long lVar5;
  ulong uStack_38;
  int32_t lenParsed;
  
  iVar4 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    lVar5 = 0;
    while( true ) {
      iVar2 = (int)lVar5;
      if (src[lVar5] == '\0') {
        if (lVar5 != 0) {
          if (dest != (UChar *)0x0) {
            _appendUChars(dest + iVar4,destCapacity - iVar4,src,iVar2);
          }
          iVar4 = iVar4 + iVar2;
        }
        if (dest == (UChar *)0x0) {
          return iVar4;
        }
        if (destCapacity <= iVar4) {
          return iVar4;
        }
        dest = dest + iVar4;
        goto LAB_002c3b58;
      }
      if (src[lVar5] == '\\') break;
      lVar5 = lVar5 + 1;
    }
    uStack_38 = uStack_38 & 0xffffffff;
    if (lVar5 != 0) {
      if (dest != (UChar *)0x0) {
        _appendUChars(dest + iVar4,destCapacity - iVar4,src,iVar2);
      }
      iVar4 = iVar4 + iVar2;
    }
    sVar3 = strlen(src + lVar5 + 1);
    uVar1 = u_unescapeAt_63(_charPtr_charAt,&lenParsed,(int32_t)sVar3,src + lVar5 + 1);
    if ((long)lenParsed == 0) break;
    iVar2 = 2;
    if ((dest == (UChar *)0x0) || (destCapacity - iVar4 < (int)(2 - (uint)(uVar1 < 0x10000)))) {
      iVar2 = 2 - (uint)(uVar1 < 0x10000);
    }
    else if (uVar1 < 0x10000) {
      dest[iVar4] = (UChar)uVar1;
      iVar2 = 1;
    }
    else {
      dest[iVar4] = (short)(uVar1 >> 10) + L'ퟀ';
      dest[(long)iVar4 + 1] = (UChar)uVar1 & 0x3ffU | 0xdc00;
    }
    src = src + lVar5 + lenParsed + 1;
    iVar4 = iVar4 + iVar2;
  }
  iVar4 = 0;
  if (0 < destCapacity && dest != (UChar *)0x0) {
LAB_002c3b58:
    *dest = L'\0';
  }
  return iVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_unescape(const char *src, UChar *dest, int32_t destCapacity) {
    const char *segment = src;
    int32_t i = 0;
    char c;

    while ((c=*src) != 0) {
        /* '\\' intentionally written as compiler-specific
         * character constant to correspond to compiler-specific
         * char* constants. */
        if (c == '\\') {
            int32_t lenParsed = 0;
            UChar32 c32;
            if (src != segment) {
                if (dest != NULL) {
                    _appendUChars(dest + i, destCapacity - i,
                                  segment, (int32_t)(src - segment));
                }
                i += (int32_t)(src - segment);
            }
            ++src; /* advance past '\\' */
            c32 = (UChar32)u_unescapeAt(_charPtr_charAt, &lenParsed, (int32_t)uprv_strlen(src), (void*)src);
            if (lenParsed == 0) {
                goto err;
            }
            src += lenParsed; /* advance past escape seq. */
            if (dest != NULL && U16_LENGTH(c32) <= (destCapacity - i)) {
                U16_APPEND_UNSAFE(dest, i, c32);
            } else {
                i += U16_LENGTH(c32);
            }
            segment = src;
        } else {
            ++src;
        }
    }
    if (src != segment) {
        if (dest != NULL) {
            _appendUChars(dest + i, destCapacity - i,
                          segment, (int32_t)(src - segment));
        }
        i += (int32_t)(src - segment);
    }
    if (dest != NULL && i < destCapacity) {
        dest[i] = 0;
    }
    return i;

 err:
    if (dest != NULL && destCapacity > 0) {
        *dest = 0;
    }
    return 0;
}